

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sandbox.cpp
# Opt level: O2

void __thiscall Sandbox::renderDone(Sandbox *this)

{
  Tracker *this_00;
  string *__lhs;
  bool bVar1;
  int local_8c;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  this_00 = &(this->uniforms).tracker;
  if ((this->uniforms).tracker.m_running == true) {
    std::__cxx11::string::string((string *)&local_88,"update:post_render",(allocator *)&local_8c);
    Tracker::begin(this_00,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
  }
  bVar1 = isRecording();
  if (bVar1) {
    local_8c = getRecordingCount();
    vera::toString<int>(&local_88,&local_8c,0,5,'0');
    std::operator+(&local_68,&local_88,".png");
    onScreenshot(this,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    recordingFrameAdded();
  }
  else {
    __lhs = &this->screenshotFile;
    bVar1 = std::operator!=(__lhs,"");
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_48,(string *)__lhs);
      onScreenshot(this,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::assign((char *)__lhs);
    }
  }
  unflagChange(this);
  if (this->m_plot != PLOT_OFF) {
    onPlot(this);
  }
  if (this->m_initialized == false) {
    this->m_initialized = true;
    vera::updateViewport();
    this->m_change = true;
  }
  if ((this->uniforms).tracker.m_running == true) {
    std::__cxx11::string::string((string *)&local_88,"update:post_render",(allocator *)&local_8c);
    Tracker::end(this_00,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
  }
  return;
}

Assistant:

void Sandbox::renderDone() {
    TRACK_BEGIN("update:post_render")

    // RECORD
    if (isRecording()) {
        onScreenshot( vera::toString( getRecordingCount() , 0, 5, '0') + ".png");
        recordingFrameAdded();
    }
    // SCREENSHOT 
    else if (screenshotFile != "") {
        onScreenshot(screenshotFile);
        screenshotFile = "";
    }

    unflagChange();

    if (m_plot != PLOT_OFF)
        onPlot();

    if (!m_initialized) {
        m_initialized = true;
        vera::updateViewport();
        flagChange();
    }

    TRACK_END("update:post_render")
}